

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteModule
          (BinaryWriterSpec *this,string_view filename,Module *module)

{
  Result rhs;
  Stream *stream;
  Module *module_local;
  BinaryWriterSpec *this_local;
  string_view filename_local;
  
  stream = std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::
           operator()(&this->module_stream_factory_,filename);
  rhs = WriteBinaryModule(stream,module,this->options_);
  Result::operator|=(&this->result_,rhs);
  return;
}

Assistant:

void BinaryWriterSpec::WriteModule(std::string_view filename,
                                   const Module& module) {
  result_ |=
      WriteBinaryModule(module_stream_factory_(filename), &module, options_);
}